

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

bool tcu::anon_unknown_3::verifyLineGroupPixelIndependentInterpolation
               (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log,
               LineInterpolationMethod interpolationMethod)

{
  RGBA RVar1;
  undefined4 __fd;
  bool bVar2;
  int i_3;
  pointer pSVar3;
  ulong uVar4;
  ostream *poVar5;
  allocator_type *paVar6;
  Surface *pSVar7;
  ChannelType CVar8;
  long lVar9;
  long lVar10;
  SingleSampleNarrowLineCandidate *__args;
  SingleSampleNarrowLineCandidate *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar11;
  ChannelOrder CVar12;
  ulong uVar13;
  ostringstream *poVar14;
  long lVar15;
  undefined1 auVar16 [8];
  ChannelOrder CVar17;
  int iVar18;
  ulong uVar19;
  allocator_type *paVar20;
  ChannelOrder CVar21;
  allocator_type *paVar22;
  long lVar23;
  allocator_type *paVar24;
  int dy;
  int iVar25;
  ChannelType CVar26;
  allocator_type *paVar27;
  LineSceneSpec *pLVar28;
  allocator_type *paVar29;
  uint uVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  RGBA color;
  Vec4 valueMax;
  Vector<float,_4> res_4;
  IVec3 pixelNativeColor;
  IVec3 formatLimit;
  Vec2 pa;
  Surface errorMask;
  Vec4 valueMin;
  Vec2 pb;
  IVec2 viewportSize;
  Vector<float,_3> res_13;
  Vector<float,_3> res_12;
  Vector<float,_3> res_10;
  Vector<float,_3> res_11;
  Vector<float,_3> res_8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> screenspaceLines;
  Vector<float,_4> res;
  LineInterpolationRange range;
  TextureLevel referenceLineMap;
  allocator_type *local_568;
  int local_55c;
  int local_54c;
  allocator_type *local_548;
  long local_540;
  RGBA local_51c;
  undefined1 local_518 [8];
  size_type sStack_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  Surface *local_4f0;
  ulong local_4e8;
  uint local_4e0;
  int local_4dc;
  string local_4d8;
  string local_4b8;
  string local_498;
  undefined1 local_478 [16];
  LineSceneSpec *local_468;
  LineInterpolationMethod local_45c;
  float local_458;
  float local_454;
  float local_450;
  float local_44c;
  float local_448;
  float local_444;
  undefined1 local_440 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  Surface local_420;
  undefined1 local_408 [8];
  ulong uStack_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  _Alloc_hider local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  string local_3c0;
  ulong local_3a0;
  IVec2 local_398;
  Vector<float,_3> local_390;
  Vector<float,_3> local_380;
  float local_370 [4];
  Vector<float,_3> local_360;
  float local_350 [4];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_340;
  undefined1 local_328 [32];
  float fStack_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2f8;
  float fStack_2e8;
  float local_2e4;
  float fStack_2e0;
  ios_base local_2b0 [268];
  float local_1a4 [15];
  undefined1 local_168 [8];
  undefined8 uStack_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [6];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b8;
  undefined1 local_a8 [16];
  TextureLevel local_90;
  float local_68;
  PixelBufferAccess local_58;
  
  local_398.m_data[0] = surface->m_width;
  local_398.m_data[1] = surface->m_height;
  local_45c = interpolationMethod;
  Surface::Surface(&local_420,local_398.m_data[0],local_398.m_data[1]);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_340,
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_328);
  local_328._0_4_ = R;
  local_328._4_4_ = UNSIGNED_INT8;
  TextureLevel::TextureLevel
            (&local_90,(TextureFormat *)local_328,surface->m_width,surface->m_height,1);
  TextureLevel::getAccess((PixelBufferAccess *)local_328,&local_90);
  local_168._0_4_ = R;
  local_168._4_4_ = SNORM_INT8;
  uStack_160 = 0;
  tcu::clear((PixelBufferAccess *)local_328,(IVec4 *)local_168);
  local_168._0_4_ = RGBA;
  local_168._4_4_ = UNORM_INT8;
  if ((void *)local_420.m_pixels.m_cap != (void *)0x0) {
    local_420.m_pixels.m_cap = (size_t)local_420.m_pixels.m_ptr;
  }
  PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_328,(TextureFormat *)local_168,local_420.m_width,
             local_420.m_height,1,(void *)local_420.m_pixels.m_cap);
  local_168._0_4_ = R;
  local_168._4_4_ = SNORM_INT8;
  uStack_160 = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)local_328,(Vec4 *)local_168);
  poVar14 = (ostringstream *)(local_328 + 8);
  local_328._0_4_ = SUB84(log,0);
  __fd = local_328._0_4_;
  local_328._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar14,"Verifying rasterization result. Native format is RGB",0x34);
  std::ostream::operator<<(poVar14,args->redBits);
  std::ostream::operator<<(poVar14,args->greenBits);
  std::ostream::operator<<(poVar14,args->blueBits);
  MessageBuilder::operator<<((MessageBuilder *)local_328,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar14);
  std::ios_base::~ios_base(local_2b0);
  if (((8 < args->redBits) || (8 < args->greenBits)) || (8 < args->blueBits)) {
    poVar14 = (ostringstream *)(local_328 + 8);
    local_328._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar14,
               "Warning! More than 8 bits in a color channel, this may produce false negatives.",
               0x4f);
    MessageBuilder::operator<<((MessageBuilder *)local_328,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar14);
    std::ios_base::~ios_base(local_2b0);
  }
  genScreenSpaceLines(&local_340,&scene->lines,&local_398);
  local_4e8 = CONCAT44(local_4e8._4_4_,scene->lineWidth);
  TextureLevel::getAccess(&local_58,&local_90);
  setMaskMapCoverageBitForLines(&local_340,(float)local_4e8,&local_58);
  local_54c = 0;
  local_55c = 0;
  local_4f0 = surface;
  if (1 < surface->m_height + -1) {
    CVar8 = SNORM_INT16;
    local_55c = 0;
    local_54c = 0;
    local_468 = scene;
    do {
      iVar25 = surface->m_width;
      if (1 < iVar25 + -1) {
        CVar12 = A;
        local_4e8 = 0;
        do {
          local_51c.m_value =
               *(uint *)((long)(surface->m_pixels).m_ptr + (long)(int)(iVar25 * CVar8 + CVar12) * 4)
          ;
          convertRGB8ToNativeFormat((anon_unknown_3 *)&local_4b8,&local_51c,args);
          iVar25 = -1;
          local_498._M_string_length._0_4_ = ~(-1 << ((byte)args->blueBits & 0x1f));
          local_498._M_dataplus._M_p._4_4_ = ~(-1 << ((byte)args->greenBits & 0x1f));
          local_498._M_dataplus._M_p._0_4_ = ~(-1 << ((byte)args->redBits & 0x1f));
          CVar17 = 0xffff;
          CVar21 = R;
          do {
            iVar11 = 0;
            do {
              TextureLevel::getAccess((PixelBufferAccess *)local_328,&local_90);
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_168,(int)(PixelBufferAccess *)local_328,
                         (int)local_4e8 + iVar11,iVar25 + CVar8);
              CVar21 = CVar21 | local_168._0_4_;
              CVar17 = CVar17 & local_168._0_4_;
              iVar11 = iVar11 + 1;
            } while (iVar11 != 3);
            iVar25 = iVar25 + 1;
          } while (iVar25 != 2);
          if (CVar17 == R) {
            local_328._0_4_ = 0xff000000;
            bVar2 = compareColors(&local_51c,(RGBA *)local_328,args->redBits,args->greenBits,
                                  args->blueBits);
            if (!bVar2) goto LAB_00a8ea7b;
            local_568 = (allocator_type *)0x0;
            local_548 = (allocator_type *)0x0;
          }
          else {
LAB_00a8ea7b:
            pSVar3 = (local_468->lines).
                     super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((int)((ulong)((long)(local_468->lines).
                                    super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) >> 6)
                < 1) {
              local_568 = (allocator_type *)0x0;
              paVar27 = (allocator_type *)0x0;
              local_548 = (allocator_type *)0x0;
              uVar4 = 0;
            }
            else {
              lVar9 = 0x20;
              lVar15 = 0x30;
              local_568 = (allocator_type *)0x0;
              lVar23 = 0;
              local_548 = (allocator_type *)0x0;
              paVar27 = (allocator_type *)0x0;
              local_3a0 = 0;
              pLVar28 = local_468;
              do {
                CVar17 = (ChannelOrder)lVar23;
                if ((CVar21 >> (CVar17 & (sBGR|sRGBA)) & 1) != 0) {
                  fVar31 = *(float *)((long)pSVar3[lVar23].positions[0].m_data + 0xc);
                  fVar32 = *(float *)((long)(pSVar3[lVar23].positions + 1) + 0xc);
                  local_440._0_8_ =
                       *(undefined8 *)
                        local_340.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar23].m_data;
                  local_3c0._M_dataplus._M_p =
                       *(pointer *)
                        (local_340.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar23].m_data + 2);
                  if (local_45c == LINEINTERPOLATION_STRICTLY_CORRECT) {
                    local_328._0_4_ = CVar12;
                    local_328._4_4_ = CVar8;
                    tcu::(anonymous_namespace)::
                    calcSingleSampleLineInterpolationRangeWithWeightEquation<tcu::(anonymous_namespace)::LineInterpolationRange(*)(tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&)>
                              ((Vec2 *)local_168,fVar31,(Vec2 *)local_440,fVar32,(IVec2 *)&local_3c0
                               ,(int)local_328,
                               (_func_LineInterpolationRange_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr
                                *)(ulong)(uint)args->subpixelBits);
                  }
                  else {
                    local_408._4_4_ = CVar8;
                    local_408._0_4_ = CVar12;
                    tcu::(anonymous_namespace)::
                    calcSingleSampleLineInterpolationRangeWithWeightEquation<tcu::(anonymous_namespace)::LineInterpolationRange(*)(tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&)>
                              ((Vec2 *)local_168,fVar31,(Vec2 *)local_440,fVar32,(IVec2 *)&local_3c0
                               ,(int)local_408,
                               (_func_LineInterpolationRange_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr
                                *)(ulong)(uint)args->subpixelBits);
                  }
                  fVar31 = 1.0;
                  if ((float)uStack_160 <= 1.0) {
                    fVar31 = (float)uStack_160;
                  }
                  pSVar3 = (pLVar28->lines).
                           super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  local_328._0_4_ = R;
                  local_328._4_4_ = SNORM_INT8;
                  local_328._8_4_ = 0;
                  local_328._12_4_ = 0;
                  lVar10 = 0;
                  do {
                    *(float *)(local_328 + lVar10 * 4) =
                         *(float *)((long)pSVar3->positions[0].m_data + lVar10 * 4 + lVar9) *
                         (float)(~-(uint)((float)uStack_160 < 0.0) & (uint)fVar31);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 4);
                  fVar31 = 1.0;
                  if (uStack_160._4_4_ <= 1.0) {
                    fVar31 = uStack_160._4_4_;
                  }
                  local_518 = (undefined1  [8])0x0;
                  sStack_510 = 0;
                  lVar10 = 0;
                  do {
                    *(float *)(local_518 + lVar10 * 4) =
                         *(float *)((long)pSVar3->positions[0].m_data + lVar10 * 4 + lVar15) *
                         (float)(~-(uint)(uStack_160._4_4_ < 0.0) & (uint)fVar31);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 4);
                  local_408 = (undefined1  [8])0x0;
                  uStack_400 = 0;
                  lVar10 = 0;
                  do {
                    *(float *)(local_408 + lVar10 * 4) =
                         *(float *)(local_328 + lVar10 * 4) + *(float *)(local_518 + lVar10 * 4);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 4);
                  fVar31 = 1.0;
                  if ((float)local_168._0_4_ <= 1.0) {
                    fVar31 = (float)local_168._0_4_;
                  }
                  local_328._0_4_ = R;
                  local_328._4_4_ = SNORM_INT8;
                  local_328._8_4_ = 0;
                  local_328._12_4_ = 0;
                  lVar10 = 0;
                  do {
                    *(float *)(local_328 + lVar10 * 4) =
                         *(float *)((long)pSVar3->positions[0].m_data + lVar10 * 4 + lVar9) *
                         (float)(~-(uint)((float)local_168._0_4_ < 0.0) & (uint)fVar31);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 4);
                  fVar31 = 1.0;
                  if ((float)local_168._4_4_ <= 1.0) {
                    fVar31 = (float)local_168._4_4_;
                  }
                  local_4d8._M_dataplus._M_p = (pointer)0x0;
                  local_4d8._M_string_length = 0;
                  lVar10 = 0;
                  do {
                    *(float *)((long)&local_4d8._M_dataplus._M_p + lVar10 * 4) =
                         *(float *)((long)pSVar3->positions[0].m_data + lVar10 * 4 + lVar15) *
                         (float)(~-(uint)((float)local_168._4_4_ < 0.0) & (uint)fVar31);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 4);
                  local_518 = (undefined1  [8])0x0;
                  sStack_510 = 0;
                  lVar10 = 0;
                  do {
                    *(float *)(local_518 + lVar10 * 4) =
                         *(float *)(local_328 + lVar10 * 4) +
                         *(float *)((long)&local_4d8._M_dataplus._M_p + lVar10 * 4);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 4);
                  local_b8 = (float)(int)(uint)local_498._M_dataplus._M_p;
                  local_444 = (float)local_408._0_4_;
                  fVar31 = (float)local_408._0_4_ * local_b8;
                  local_68 = local_b8;
                  if (fVar31 <= local_b8) {
                    local_68 = fVar31;
                  }
                  fVar32 = (float)(int)local_498._M_dataplus._M_p._4_4_;
                  local_68 = (float)(~-(uint)(fVar31 < 0.0) & (uint)local_68);
                  local_448 = (float)local_408._4_4_;
                  fVar33 = (float)local_408._4_4_ * fVar32;
                  fVar31 = fVar32;
                  if (fVar33 <= fVar32) {
                    fVar31 = fVar33;
                  }
                  local_478 = ZEXT416(~-(uint)(fVar33 < 0.0) & (uint)fVar31);
                  fVar31 = (float)(int)(uint)local_498._M_string_length;
                  local_44c = (float)uStack_400;
                  fVar34 = (float)uStack_400 * fVar31;
                  fVar33 = fVar31;
                  if (fVar34 <= fVar31) {
                    fVar33 = fVar34;
                  }
                  local_a8 = ZEXT416(~-(uint)(fVar34 < 0.0) & (uint)fVar33);
                  local_450 = (float)local_518._0_4_;
                  fVar33 = (float)local_518._0_4_ * local_b8;
                  if (fVar33 <= local_b8) {
                    local_b8 = fVar33;
                  }
                  local_b8 = (float)(~-(uint)(fVar33 < 0.0) & (uint)local_b8);
                  local_454 = (float)local_518._4_4_;
                  fVar33 = (float)local_518._4_4_ * fVar32;
                  if (fVar33 <= fVar32) {
                    fVar32 = fVar33;
                  }
                  local_c8 = ZEXT416(~-(uint)(fVar33 < 0.0) & (uint)fVar32);
                  local_458 = (float)sStack_510;
                  fVar32 = (float)sStack_510 * fVar31;
                  if (fVar32 <= fVar31) {
                    fVar31 = fVar32;
                  }
                  local_d8 = ZEXT416(~-(uint)(fVar32 < 0.0) & (uint)fVar31);
                  fVar31 = floorf(local_68);
                  CVar26 = (ChannelType)fVar31;
                  fVar31 = floorf((float)local_478._0_4_);
                  fVar32 = floorf((float)local_a8._0_4_);
                  iVar18 = (int)fVar31;
                  local_4dc = (int)fVar32;
                  fVar31 = ceilf(local_b8);
                  local_4e0 = (uint)fVar31;
                  fVar31 = ceilf((float)local_c8._0_4_);
                  fVar32 = ceilf((float)local_d8._0_4_);
                  iVar25 = (int)fVar31;
                  iVar11 = (int)fVar32;
                  if (((((int)local_4b8._M_dataplus._M_p < (int)CVar26) ||
                       (local_4b8._M_dataplus._M_p._4_4_ < iVar18)) ||
                      (((int)local_4b8._M_string_length < local_4dc ||
                       (((int)local_4e0 < (int)local_4b8._M_dataplus._M_p ||
                        (iVar25 < local_4b8._M_dataplus._M_p._4_4_)))))) ||
                     (iVar11 < (int)local_4b8._M_string_length)) {
                    bVar2 = true;
                    if (local_55c < 4) {
                      local_328._12_4_ = local_4dc;
                      __args = (SingleSampleNarrowLineCandidate *)(ulong)local_4e0;
                      local_328._16_4_ = local_4e0;
                      local_328._28_4_ = local_68;
                      fStack_308 = (float)local_478._0_4_;
                      fStack_304 = (float)local_a8._0_4_;
                      fStack_300 = local_b8;
                      fStack_2fc = (float)local_c8._0_4_;
                      aStack_2f8._M_allocated_capacity._0_4_ = local_d8._0_4_;
                      aStack_2f8._M_allocated_capacity._4_4_ = local_444;
                      aStack_2f8._8_4_ = local_448;
                      aStack_2f8._12_4_ = local_44c;
                      fStack_2e8 = local_450;
                      fStack_2e0 = local_458;
                      local_2e4 = local_454;
                      local_328._0_4_ = CVar17;
                      local_328._4_4_ = CVar26;
                      local_328._8_4_ = iVar18;
                      local_328._20_4_ = iVar25;
                      local_328._24_4_ = iVar11;
                      if (paVar27 == local_548) {
                        if ((long)paVar27 - (long)local_568 == 0x7fffffffffffffc8) {
                          std::__throw_length_error("vector::_M_realloc_insert");
                        }
                        lVar10 = (long)paVar27 - (long)local_568 >> 2;
                        uVar13 = lVar10 * -0x79435e50d79435e5;
                        uVar4 = uVar13;
                        if (paVar27 == local_568) {
                          uVar4 = 1;
                        }
                        uVar19 = uVar4 + uVar13;
                        if (0x1af286bca1af285 < uVar19) {
                          uVar19 = 0x1af286bca1af286;
                        }
                        if (CARRY8(uVar4,uVar13)) {
                          uVar19 = 0x1af286bca1af286;
                        }
                        if (uVar19 == 0) {
                          paVar6 = (allocator_type *)0x0;
                        }
                        else {
                          paVar6 = (allocator_type *)operator_new(uVar19 * 0x4c);
                          __args = extraout_RDX;
                        }
                        std::
                        allocator_traits<std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>>
                        ::
                        construct<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate_const&>
                                  (paVar6 + lVar10 * 4,(SingleSampleNarrowLineCandidate *)local_328,
                                   __args);
                        local_478._0_8_ = paVar6;
                        for (paVar29 = local_568; paVar27 != paVar29; paVar29 = paVar29 + 0x4c) {
                          *(undefined4 *)paVar6 = *(undefined4 *)paVar29;
                          lVar10 = 1;
                          do {
                            *(undefined4 *)(paVar6 + lVar10 * 4) =
                                 *(undefined4 *)(paVar29 + lVar10 * 4);
                            lVar10 = lVar10 + 1;
                          } while (lVar10 != 4);
                          lVar10 = 4;
                          do {
                            *(undefined4 *)(paVar6 + lVar10 * 4) =
                                 *(undefined4 *)(paVar29 + lVar10 * 4);
                            lVar10 = lVar10 + 1;
                          } while (lVar10 != 7);
                          lVar10 = 7;
                          do {
                            *(undefined4 *)(paVar6 + lVar10 * 4) =
                                 *(undefined4 *)(paVar29 + lVar10 * 4);
                            lVar10 = lVar10 + 1;
                          } while (lVar10 != 10);
                          lVar10 = 10;
                          do {
                            *(undefined4 *)(paVar6 + lVar10 * 4) =
                                 *(undefined4 *)(paVar29 + lVar10 * 4);
                            lVar10 = lVar10 + 1;
                          } while (lVar10 != 0xd);
                          lVar10 = 0xd;
                          do {
                            *(undefined4 *)(paVar6 + lVar10 * 4) =
                                 *(undefined4 *)(paVar29 + lVar10 * 4);
                            lVar10 = lVar10 + 1;
                          } while (lVar10 != 0x10);
                          lVar10 = 0x10;
                          do {
                            *(undefined4 *)(paVar6 + lVar10 * 4) =
                                 *(undefined4 *)(paVar29 + lVar10 * 4);
                            lVar10 = lVar10 + 1;
                          } while (lVar10 != 0x13);
                          paVar6 = paVar6 + 0x4c;
                        }
                        if (local_568 != (allocator_type *)0x0) {
                          operator_delete(local_568,(long)local_548 - (long)local_568);
                        }
                        local_548 = (allocator_type *)(local_478._0_8_ + uVar19 * 0x4c);
                        local_568 = (allocator_type *)local_478._0_8_;
                      }
                      else {
                        std::
                        allocator_traits<std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>>
                        ::
                        construct<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate_const&>
                                  (paVar27,(SingleSampleNarrowLineCandidate *)local_328,__args);
                        paVar6 = paVar27;
                      }
                      paVar27 = paVar6 + 0x4c;
                      bVar2 = true;
                    }
                  }
                  else {
                    bVar2 = false;
                    local_3a0 = CONCAT71((uint7)(uint3)((uint)iVar25 >> 8),1);
                  }
                  uVar4 = local_3a0;
                  pLVar28 = local_468;
                  if (!bVar2) break;
                }
                lVar23 = lVar23 + 1;
                pSVar3 = (pLVar28->lines).
                         super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                lVar9 = lVar9 + 0x40;
                lVar15 = lVar15 + 0x40;
                uVar4 = local_3a0;
              } while (lVar23 < (int)((ulong)((long)(pLVar28->lines).
                                                                                                        
                                                  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)pSVar3) >> 6));
            }
            poVar14 = (ostringstream *)(local_328 + 8);
            if ((uVar4 & 1) == 0) {
              local_54c = local_54c + 1;
              *(undefined4 *)
               ((long)local_420.m_pixels.m_ptr + (long)(int)(local_420.m_width * CVar8 + CVar12) * 4
               ) = 0xff0000ff;
              local_55c = local_55c + 1;
              if (local_55c < 4) {
                local_328._0_8_ = log;
                std::__cxx11::ostringstream::ostringstream(poVar14);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar14,"Found an invalid pixel at (",0x1b);
                std::ostream::operator<<(poVar14,CVar12);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,",",1);
                std::ostream::operator<<(poVar14,CVar8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,"), ",3);
                iVar25 = (int)((ulong)((long)paVar27 - (long)local_568) >> 2);
                std::ostream::operator<<(poVar14,iVar25 * 0x286bca1b);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar14," candidate reference value(s) found:\n",0x25);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar14,"\tPixel color:\t\t",0xf);
                RVar1.m_value = local_51c.m_value;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,"RGBA(",5);
                poVar5 = (ostream *)std::ostream::operator<<(poVar14,RVar1.m_value & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,RVar1.m_value >> 8 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,RVar1.m_value >> 0x10 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,RVar1.m_value >> 0x18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,"\n",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar14,"\tNative color:\t\t",0x10);
                tcu::operator<<((ostream *)poVar14,(Vector<int,_3> *)&local_4b8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,"\n",1);
                MessageBuilder::operator<<
                          ((MessageBuilder *)local_328,(EndMessageToken *)&TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream(poVar14);
                std::ios_base::~ios_base(local_2b0);
                if (0 < iVar25 * 0x286bca1b) {
                  local_478._0_8_ = (long)(iVar25 * 0x286bca1b);
                  paVar27 = local_568 + 4;
                  paVar6 = local_568 + 0x10;
                  paVar29 = local_568 + 0x1c;
                  paVar22 = local_568 + 0x28;
                  paVar20 = local_568 + 0x34;
                  paVar24 = local_568 + 0x40;
                  local_540 = 0;
                  do {
                    poVar14 = (ostringstream *)(local_328 + 8);
                    local_328._0_8_ = log;
                    std::__cxx11::ostringstream::ostringstream(poVar14);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar14,"\tCandidate (line ",0x11);
                    std::ostream::operator<<(poVar14,*(int *)(local_568 + local_540 * 0x4c));
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,"):\n",3);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar14,"\t\tReference native color min: ",0x1e);
                    local_408 = (undefined1  [8])0x0;
                    uStack_400 = uStack_400 & 0xffffffff00000000;
                    uStack_160 = uStack_160 & 0xffffffff00000000;
                    local_168._0_4_ = R;
                    local_168._4_4_ = SNORM_INT8;
                    lVar9 = 0;
                    do {
                      iVar25 = *(int *)(paVar27 + lVar9 * 4);
                      iVar11 = *(int *)((long)&local_498._M_dataplus._M_p + lVar9 * 4);
                      if (iVar25 < iVar11) {
                        iVar11 = iVar25;
                      }
                      if (iVar25 < *(int *)(local_408 + lVar9 * 4)) {
                        iVar11 = *(int *)(local_408 + lVar9 * 4);
                      }
                      *(int *)(local_168 + lVar9 * 4) = iVar11;
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 3);
                    poVar5 = (ostream *)(local_328 + 8);
                    tcu::operator<<(poVar5,(Vector<int,_3> *)local_168);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar5,"\t\tReference native color max: ",0x1e);
                    local_4d8._M_dataplus._M_p = (pointer)0x0;
                    local_4d8._M_string_length = local_4d8._M_string_length & 0xffffffff00000000;
                    sStack_510 = sStack_510 & 0xffffffff00000000;
                    local_518 = (undefined1  [8])0x0;
                    lVar9 = 0;
                    do {
                      iVar25 = *(int *)(paVar6 + lVar9 * 4);
                      iVar11 = *(int *)((long)&local_498._M_dataplus._M_p + lVar9 * 4);
                      if (iVar25 < iVar11) {
                        iVar11 = iVar25;
                      }
                      iVar18 = *(int *)((long)&local_4d8._M_dataplus._M_p + lVar9 * 4);
                      if (iVar25 < iVar18) {
                        iVar11 = iVar18;
                      }
                      *(int *)(local_518 + lVar9 * 4) = iVar11;
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 3);
                    poVar5 = (ostream *)(local_328 + 8);
                    tcu::operator<<(poVar5,(Vector<int,_3> *)local_518);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar5,"\t\tReference native float min: ",0x1e);
                    local_3c0._M_dataplus._M_p = (pointer)0x0;
                    local_3c0._M_string_length._0_4_ = 0;
                    local_350[2] = 0.0;
                    local_350[0] = 0.0;
                    local_350[1] = 0.0;
                    lVar9 = 0;
                    do {
                      local_350[lVar9] =
                           (float)*(int *)((long)&local_498._M_dataplus._M_p + lVar9 * 4);
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 3);
                    local_440._8_4_ = 0.0;
                    local_440._0_4_ = 0.0;
                    local_440._4_4_ = 0.0;
                    lVar9 = 0;
                    do {
                      fVar31 = *(float *)(paVar29 + lVar9 * 4);
                      fVar32 = *(float *)((long)&local_3c0._M_dataplus._M_p + lVar9 * 4);
                      fVar33 = local_350[lVar9];
                      if (fVar31 <= local_350[lVar9]) {
                        fVar33 = fVar31;
                      }
                      uVar30 = -(uint)(fVar31 < fVar32);
                      *(uint *)(local_440 + lVar9 * 4) =
                           uVar30 & (uint)fVar32 | ~uVar30 & (uint)fVar33;
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 3);
                    poVar5 = (ostream *)(local_328 + 8);
                    tcu::operator<<(poVar5,(Vector<float,_3> *)local_440);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar5,"\t\tReference native float max: ",0x1e);
                    local_1a4[0xc] = 0.0;
                    local_1a4[0xd] = 0.0;
                    local_1a4[0xe] = 0.0;
                    local_370[2] = 0.0;
                    local_370[0] = 0.0;
                    local_370[1] = 0.0;
                    lVar9 = 0;
                    do {
                      local_370[lVar9] =
                           (float)*(int *)((long)&local_498._M_dataplus._M_p + lVar9 * 4);
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 3);
                    local_360.m_data[2] = 0.0;
                    local_360.m_data[0] = 0.0;
                    local_360.m_data[1] = 0.0;
                    lVar9 = 0;
                    do {
                      fVar31 = *(float *)(paVar22 + lVar9 * 4);
                      fVar32 = local_370[lVar9];
                      if (fVar31 <= local_370[lVar9]) {
                        fVar32 = fVar31;
                      }
                      uVar30 = -(uint)(fVar31 < local_1a4[lVar9 + 0xc]);
                      local_360.m_data[lVar9] =
                           (float)(uVar30 & (uint)local_1a4[lVar9 + 0xc] | ~uVar30 & (uint)fVar32);
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 3);
                    poVar5 = (ostream *)(local_328 + 8);
                    tcu::operator<<(poVar5,&local_360);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\tFmin:\t",8);
                    local_1a4[9] = 0.0;
                    local_1a4[10] = 0.0;
                    local_1a4[0xb] = 0.0;
                    local_1a4[6] = 1.0;
                    local_1a4[7] = 1.0;
                    local_1a4[8] = 1.0;
                    local_380.m_data[2] = 0.0;
                    local_380.m_data[0] = 0.0;
                    local_380.m_data[1] = 0.0;
                    lVar9 = 0;
                    do {
                      fVar31 = *(float *)(paVar20 + lVar9 * 4);
                      fVar32 = local_1a4[lVar9 + 6];
                      if (fVar31 <= local_1a4[lVar9 + 6]) {
                        fVar32 = fVar31;
                      }
                      uVar30 = -(uint)(fVar31 < local_1a4[lVar9 + 9]);
                      local_380.m_data[lVar9] =
                           (float)(uVar30 & (uint)local_1a4[lVar9 + 9] | ~uVar30 & (uint)fVar32);
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 3);
                    poVar5 = (ostream *)(local_328 + 8);
                    tcu::operator<<(poVar5,&local_380);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t\tFmax:\t",8);
                    local_1a4[3] = 0.0;
                    local_1a4[4] = 0.0;
                    local_1a4[5] = 0.0;
                    local_1a4[0] = 1.0;
                    local_1a4[1] = 1.0;
                    local_1a4[2] = 1.0;
                    local_390.m_data[2] = 0.0;
                    local_390.m_data[0] = 0.0;
                    local_390.m_data[1] = 0.0;
                    lVar9 = 0;
                    do {
                      fVar31 = *(float *)(paVar24 + lVar9 * 4);
                      fVar32 = local_1a4[lVar9];
                      if (fVar31 <= local_1a4[lVar9]) {
                        fVar32 = fVar31;
                      }
                      uVar30 = -(uint)(fVar31 < local_1a4[lVar9 + 3]);
                      local_390.m_data[lVar9] =
                           (float)(uVar30 & (uint)local_1a4[lVar9 + 3] | ~uVar30 & (uint)fVar32);
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 3);
                    tcu::operator<<((ostream *)(local_328 + 8),&local_390);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_328 + 8),"\n",1);
                    MessageBuilder::operator<<
                              ((MessageBuilder *)local_328,(EndMessageToken *)&TestLog::EndMessage);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_328 + 8));
                    std::ios_base::~ios_base(local_2b0);
                    local_540 = local_540 + 1;
                    paVar27 = paVar27 + 0x4c;
                    paVar6 = paVar6 + 0x4c;
                    paVar29 = paVar29 + 0x4c;
                    paVar22 = paVar22 + 0x4c;
                    paVar20 = paVar20 + 0x4c;
                    paVar24 = paVar24 + 0x4c;
                  } while (local_540 < (long)local_478._0_8_);
                }
              }
            }
          }
          surface = local_4f0;
          if (local_568 != (allocator_type *)0x0) {
            operator_delete(local_568,(long)local_548 - (long)local_568);
          }
          CVar12 = CVar12 + A;
          iVar25 = surface->m_width;
          local_4e8 = (ulong)((int)local_4e8 + 1);
        } while ((int)CVar12 < iVar25 + -1);
      }
      CVar8 = CVar8 + SNORM_INT16;
    } while ((int)CVar8 < surface->m_height + -1);
  }
  if (4 < local_55c) {
    poVar14 = (ostringstream *)(local_328 + 8);
    local_328._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,"Omitted ",8);
    std::ostream::operator<<(poVar14,local_55c + -4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar14," pixel error description(s).",0x1c);
    MessageBuilder::operator<<((MessageBuilder *)local_328,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar14);
    std::ios_base::~ios_base(local_2b0);
  }
  poVar14 = (ostringstream *)(local_328 + 8);
  if (local_54c == 0) {
    local_328._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar14,"No invalid pixels found.",0x18);
    MessageBuilder::operator<<((MessageBuilder *)local_328,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar14);
    std::ios_base::~ios_base(local_2b0);
    local_408 = (undefined1  [8])&local_3f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Verification result","");
    local_518 = (undefined1  [8])&local_508;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"Result of rendering","");
    LogImageSet::LogImageSet((LogImageSet *)local_168,(string *)local_408,(string *)local_518);
    TestLog::startImageSet(log,(char *)local_168,local_148._M_p);
    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"Result","");
    local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"Result","");
    LogImage::LogImage((LogImage *)local_328,&local_4d8,&local_4b8,surface,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_328,__fd,__buf_01,(size_t)surface);
    TestLog::endImageSet(log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(fStack_304,fStack_308) != &aStack_2f8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(fStack_304,fStack_308),
                      CONCAT44(aStack_2f8._M_allocated_capacity._4_4_,
                               aStack_2f8._M_allocated_capacity._0_4_) + 1);
    }
    if (local_328._0_8_ != (long)local_328 + 0x10) {
      operator_delete((void *)local_328._0_8_,CONCAT44(local_328._20_4_,local_328._16_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
      operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_p != local_138) {
      operator_delete(local_148._M_p,local_138[0]._M_allocated_capacity + 1);
    }
    if (local_168 != (undefined1  [8])&local_158) {
      operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
    }
    if (local_518 != (undefined1  [8])&local_508) {
      operator_delete((void *)local_518,local_508._M_allocated_capacity + 1);
    }
    auVar16 = local_408;
    if (local_408 == (undefined1  [8])&local_3f8) goto LAB_00a900b1;
  }
  else {
    local_328._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar14);
    std::ostream::operator<<(poVar14,local_54c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar14," invalid pixel(s) found.",0x18);
    MessageBuilder::operator<<((MessageBuilder *)local_328,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar14);
    std::ios_base::~ios_base(local_2b0);
    local_518 = (undefined1  [8])&local_508;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"Verification result","");
    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"Result of rendering","");
    LogImageSet::LogImageSet((LogImageSet *)local_408,(string *)local_518,&local_4d8);
    TestLog::startImageSet(log,(char *)local_408,local_3e8._M_p);
    local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"Result","");
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"Result","");
    pSVar7 = local_4f0;
    LogImage::LogImage((LogImage *)local_328,&local_4b8,&local_498,local_4f0,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_328,__fd,__buf,(size_t)pSVar7);
    local_440._0_8_ = &local_430;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"ErrorMask","");
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"ErrorMask","");
    pSVar7 = &local_420;
    LogImage::LogImage((LogImage *)local_168,(string *)local_440,&local_3c0,pSVar7,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_168,__fd,__buf_00,(size_t)pSVar7);
    TestLog::endImageSet(log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_p != local_138) {
      operator_delete(local_148._M_p,local_138[0]._M_allocated_capacity + 1);
    }
    if (local_168 != (undefined1  [8])&local_158) {
      operator_delete((void *)local_168,local_158._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._0_8_ != &local_430) {
      operator_delete((void *)local_440._0_8_,local_430._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(fStack_304,fStack_308) != &aStack_2f8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(fStack_304,fStack_308),
                      CONCAT44(aStack_2f8._M_allocated_capacity._4_4_,
                               aStack_2f8._M_allocated_capacity._0_4_) + 1);
    }
    if (local_328._0_8_ != (long)local_328 + 0x10) {
      operator_delete((void *)local_328._0_8_,CONCAT44(local_328._20_4_,local_328._16_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_p != &local_3d8) {
      operator_delete(local_3e8._M_p,local_3d8._M_allocated_capacity + 1);
    }
    if (local_408 != (undefined1  [8])&local_3f8) {
      operator_delete((void *)local_408,local_3f8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
      operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
    }
    local_3f8._M_allocated_capacity = local_508._M_allocated_capacity;
    auVar16 = local_518;
    if (local_518 == (undefined1  [8])&local_508) goto LAB_00a900b1;
  }
  operator_delete((void *)auVar16,local_3f8._M_allocated_capacity + 1);
LAB_00a900b1:
  TextureLevel::~TextureLevel(&local_90);
  if (local_340.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_340.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Surface::~Surface(&local_420);
  return local_54c == 0;
}

Assistant:

bool verifyLineGroupPixelIndependentInterpolation (const tcu::Surface&				surface,
												   const LineSceneSpec&				scene,
												   const RasterizationArguments&	args,
												   tcu::TestLog&					log,
												   LineInterpolationMethod			interpolationMethod)
{
	DE_ASSERT(scene.lines.size() < 8); // coverage indices are stored as bitmask in a unsigned 8-bit ints
	DE_ASSERT(interpolationMethod == LINEINTERPOLATION_STRICTLY_CORRECT || interpolationMethod == LINEINTERPOLATION_PROJECTED);

	const tcu::RGBA			invalidPixelColor	= tcu::RGBA(255, 0, 0, 255);
	const tcu::IVec2		viewportSize		= tcu::IVec2(surface.getWidth(), surface.getHeight());
	const int				errorFloodThreshold	= 4;
	int						errorCount			= 0;
	tcu::Surface			errorMask			(surface.getWidth(), surface.getHeight());
	int						invalidPixels		= 0;
	std::vector<tcu::Vec4>	screenspaceLines	(scene.lines.size()); //!< packed (x0, y0, x1, y1)

	// Reference renderer produces correct fragments using the diamond-exit-rule. Make 2D int array, store line coverage as a 8-bit bitfield
	// The map is used to find lines with potential coverage to a given pixel
	tcu::TextureLevel		referenceLineMap	(tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT8), surface.getWidth(), surface.getHeight());

	tcu::clear(referenceLineMap.getAccess(), tcu::IVec4(0, 0, 0, 0));
	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// log format

	log << tcu::TestLog::Message << "Verifying rasterization result. Native format is RGB" << args.redBits << args.greenBits << args.blueBits << tcu::TestLog::EndMessage;
	if (args.redBits > 8 || args.greenBits > 8 || args.blueBits > 8)
		log << tcu::TestLog::Message << "Warning! More than 8 bits in a color channel, this may produce false negatives." << tcu::TestLog::EndMessage;

	// prepare lookup map

	genScreenSpaceLines(screenspaceLines, scene.lines, viewportSize);
	setMaskMapCoverageBitForLines(screenspaceLines, scene.lineWidth, referenceLineMap.getAccess());

	// Find all possible lines with coverage, check pixel color matches one of them

	for (int y = 1; y < surface.getHeight() - 1; ++y)
	for (int x = 1; x < surface.getWidth()  - 1; ++x)
	{
		const tcu::RGBA		color					= surface.getPixel(x, y);
		const tcu::IVec3	pixelNativeColor		= convertRGB8ToNativeFormat(color, args);	// Convert pixel color from rgba8 to the real pixel format. Usually rgba8 or 565
		int					lineCoverageSet			= 0;										// !< lines that may cover this fragment
		int					lineSurroundingCoverage = 0xFFFF;									// !< lines that will cover this fragment
		bool				matchFound				= false;
		const tcu::IVec3	formatLimit				((1 << args.redBits) - 1, (1 << args.greenBits) - 1, (1 << args.blueBits) - 1);

		std::vector<SingleSampleNarrowLineCandidate> candidates;

		// Find lines with possible coverage

		for (int dy = -1; dy < 2; ++dy)
		for (int dx = -1; dx < 2; ++dx)
		{
			const int coverage = referenceLineMap.getAccess().getPixelInt(x+dx, y+dy).x();

			lineCoverageSet			|= coverage;
			lineSurroundingCoverage	&= coverage;
		}

		// background color is possible?
		if (lineSurroundingCoverage == 0 && compareColors(color, tcu::RGBA::black(), args.redBits, args.greenBits, args.blueBits))
			continue;

		// Check those lines

		for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
		{
			if (((lineCoverageSet >> lineNdx) & 0x01) != 0)
			{
				const float						wa				= scene.lines[lineNdx].positions[0].w();
				const float						wb				= scene.lines[lineNdx].positions[1].w();
				const tcu::Vec2					pa				= screenspaceLines[lineNdx].swizzle(0, 1);
				const tcu::Vec2					pb				= screenspaceLines[lineNdx].swizzle(2, 3);

				const LineInterpolationRange	range			= (interpolationMethod == LINEINTERPOLATION_STRICTLY_CORRECT)
																	? (calcSingleSampleLineInterpolationRange(pa, wa, pb, wb, tcu::IVec2(x, y), args.subpixelBits))
																	: (calcSingleSampleLineInterpolationRangeAxisProjected(pa, wa, pb, wb, tcu::IVec2(x, y), args.subpixelBits));

				const tcu::Vec4					valueMin		= de::clamp(range.min.x(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[0] + de::clamp(range.min.y(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[1];
				const tcu::Vec4					valueMax		= de::clamp(range.max.x(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[0] + de::clamp(range.max.y(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[1];

				const tcu::Vec3					colorMinF		(de::clamp(valueMin.x() * (float)formatLimit.x(), 0.0f, (float)formatLimit.x()),
																 de::clamp(valueMin.y() * (float)formatLimit.y(), 0.0f, (float)formatLimit.y()),
																 de::clamp(valueMin.z() * (float)formatLimit.z(), 0.0f, (float)formatLimit.z()));
				const tcu::Vec3					colorMaxF		(de::clamp(valueMax.x() * (float)formatLimit.x(), 0.0f, (float)formatLimit.x()),
																 de::clamp(valueMax.y() * (float)formatLimit.y(), 0.0f, (float)formatLimit.y()),
																 de::clamp(valueMax.z() * (float)formatLimit.z(), 0.0f, (float)formatLimit.z()));
				const tcu::IVec3				colorMin		((int)deFloatFloor(colorMinF.x()),
																 (int)deFloatFloor(colorMinF.y()),
																 (int)deFloatFloor(colorMinF.z()));
				const tcu::IVec3				colorMax		((int)deFloatCeil (colorMaxF.x()),
																 (int)deFloatCeil (colorMaxF.y()),
																 (int)deFloatCeil (colorMaxF.z()));

				// Verify validity
				if (pixelNativeColor.x() < colorMin.x() ||
					pixelNativeColor.y() < colorMin.y() ||
					pixelNativeColor.z() < colorMin.z() ||
					pixelNativeColor.x() > colorMax.x() ||
					pixelNativeColor.y() > colorMax.y() ||
					pixelNativeColor.z() > colorMax.z())
				{
					if (errorCount < errorFloodThreshold)
					{
						// Store candidate information for logging
						SingleSampleNarrowLineCandidate candidate;

						candidate.lineNdx		= lineNdx;
						candidate.colorMin		= colorMin;
						candidate.colorMax		= colorMax;
						candidate.colorMinF		= colorMinF;
						candidate.colorMaxF		= colorMaxF;
						candidate.valueRangeMin	= valueMin.swizzle(0, 1, 2);
						candidate.valueRangeMax	= valueMax.swizzle(0, 1, 2);

						candidates.push_back(candidate);
					}
				}
				else
				{
					matchFound = true;
					break;
				}
			}
		}

		if (matchFound)
			continue;

		// invalid fragment
		++invalidPixels;
		errorMask.setPixel(x, y, invalidPixelColor);

		++errorCount;

		// don't fill the logs with too much data
		if (errorCount < errorFloodThreshold)
		{
			log << tcu::TestLog::Message
				<< "Found an invalid pixel at (" << x << "," << y << "), " << (int)candidates.size() << " candidate reference value(s) found:\n"
				<< "\tPixel color:\t\t" << color << "\n"
				<< "\tNative color:\t\t" << pixelNativeColor << "\n"
				<< tcu::TestLog::EndMessage;

			for (int candidateNdx = 0; candidateNdx < (int)candidates.size(); ++candidateNdx)
			{
				const SingleSampleNarrowLineCandidate& candidate = candidates[candidateNdx];

				log << tcu::TestLog::Message << "\tCandidate (line " << candidate.lineNdx << "):\n"
					<< "\t\tReference native color min: " << tcu::clamp(candidate.colorMin, tcu::IVec3(0,0,0), formatLimit) << "\n"
					<< "\t\tReference native color max: " << tcu::clamp(candidate.colorMax, tcu::IVec3(0,0,0), formatLimit) << "\n"
					<< "\t\tReference native float min: " << tcu::clamp(candidate.colorMinF, tcu::Vec3(0.0f, 0.0f, 0.0f), formatLimit.cast<float>()) << "\n"
					<< "\t\tReference native float max: " << tcu::clamp(candidate.colorMaxF, tcu::Vec3(0.0f, 0.0f, 0.0f), formatLimit.cast<float>()) << "\n"
					<< "\t\tFmin:\t" << tcu::clamp(candidate.valueRangeMin, tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 1.0f)) << "\n"
					<< "\t\tFmax:\t" << tcu::clamp(candidate.valueRangeMax, tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 1.0f)) << "\n"
					<< tcu::TestLog::EndMessage;
			}
		}
	}

	// don't just hide failures
	if (errorCount > errorFloodThreshold)
		log << tcu::TestLog::Message << "Omitted " << (errorCount-errorFloodThreshold) << " pixel error description(s)." << tcu::TestLog::EndMessage;

	// report result
	if (invalidPixels)
	{
		log << tcu::TestLog::Message << invalidPixels << " invalid pixel(s) found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result",			surface)
			<< tcu::TestLog::Image("ErrorMask", "ErrorMask",	errorMask)
			<< tcu::TestLog::EndImageSet;

		return false;
	}
	else
	{
		log << tcu::TestLog::Message << "No invalid pixels found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result", surface)
			<< tcu::TestLog::EndImageSet;

		return true;
	}
}